

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O0

void __thiscall QLocalSocketPrivate::cancelDelayedConnect(QLocalSocketPrivate *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x198) != 0) {
    QSocketNotifier::setEnabled(SUB81(*(undefined8 *)(in_RDI + 0x198),0));
    if (*(long **)(in_RDI + 0x198) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x198) + 0x20))();
    }
    *(undefined8 *)(in_RDI + 0x198) = 0;
    QTimer::stop();
    if (*(long **)(in_RDI + 0x1a0) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x1a0) + 0x20))();
    }
    *(undefined8 *)(in_RDI + 0x1a0) = 0;
  }
  return;
}

Assistant:

void QLocalSocketPrivate::cancelDelayedConnect()
{
    if (delayConnect) {
        delayConnect->setEnabled(false);
        delete delayConnect;
        delayConnect = nullptr;
        connectTimer->stop();
        delete connectTimer;
        connectTimer = nullptr;
    }
}